

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepTrim.h
# Opt level: O1

void anurbs::BrepTrim::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  class_<anurbs::BrepTrim,std::shared_ptr<anurbs::BrepTrim>> *pcVar1;
  string name;
  class_<anurbs::BrepTrim,_std::shared_ptr<anurbs::BrepTrim>_> local_c0;
  long *local_b8;
  undefined8 local_b0;
  long local_a8;
  undefined1 local_a0;
  code *local_98;
  undefined8 local_90;
  code *local_88;
  undefined8 local_80;
  code *local_78;
  undefined8 local_70;
  code *local_68;
  undefined8 local_60;
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  code *local_38;
  undefined8 local_30;
  code *local_28;
  undefined8 local_20;
  
  local_a8 = 0x6d69725470657242;
  local_b0 = 8;
  local_a0 = 0;
  local_b8 = &local_a8;
  pybind11::class_<anurbs::BrepTrim,_std::shared_ptr<anurbs::BrepTrim>_>::class_<>
            (&local_c0,(m->super_object).super_handle.m_ptr,(char *)&local_a8);
  local_28 = brep;
  local_20 = 0;
  pcVar1 = (class_<anurbs::BrepTrim,std::shared_ptr<anurbs::BrepTrim>> *)
           pybind11::class_<anurbs::BrepTrim,std::shared_ptr<anurbs::BrepTrim>>::
           def_property_readonly<anurbs::Ref<anurbs::Brep>(anurbs::BrepTrim::*)()const>
                     ((class_<anurbs::BrepTrim,std::shared_ptr<anurbs::BrepTrim>> *)&local_c0,"brep"
                      ,(offset_in_Model_to_subr *)&local_28);
  local_38 = curve_2d;
  local_30 = 0;
  pcVar1 = (class_<anurbs::BrepTrim,std::shared_ptr<anurbs::BrepTrim>> *)
           pybind11::class_<anurbs::BrepTrim,std::shared_ptr<anurbs::BrepTrim>>::
           def_property_readonly<std::shared_ptr<anurbs::Curve<2l,std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>>>(anurbs::BrepTrim::*)()const>
                     (pcVar1,"curve_2d",(offset_in_Model_to_subr *)&local_38);
  local_48 = curve_3d;
  local_40 = 0;
  pcVar1 = (class_<anurbs::BrepTrim,std::shared_ptr<anurbs::BrepTrim>> *)
           pybind11::class_<anurbs::BrepTrim,std::shared_ptr<anurbs::BrepTrim>>::
           def_property_readonly<std::shared_ptr<anurbs::CurveOnSurface<3l,std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>>(anurbs::BrepTrim::*)()const>
                     (pcVar1,"curve_3d",(offset_in_Model_to_subr *)&local_48);
  local_58 = curve_geometry;
  local_50 = 0;
  pcVar1 = (class_<anurbs::BrepTrim,std::shared_ptr<anurbs::BrepTrim>> *)
           pybind11::class_<anurbs::BrepTrim,std::shared_ptr<anurbs::BrepTrim>>::
           def_property_readonly<anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>(anurbs::BrepTrim::*)()const>
                     (pcVar1,"curve_geometry",(offset_in_Model_to_subr *)&local_58);
  local_68 = edge;
  local_60 = 0;
  pcVar1 = (class_<anurbs::BrepTrim,std::shared_ptr<anurbs::BrepTrim>> *)
           pybind11::class_<anurbs::BrepTrim,std::shared_ptr<anurbs::BrepTrim>>::
           def_property_readonly<anurbs::Ref<anurbs::BrepEdge>(anurbs::BrepTrim::*)()const>
                     (pcVar1,"edge",(offset_in_Model_to_subr *)&local_68);
  local_78 = face;
  local_70 = 0;
  pcVar1 = (class_<anurbs::BrepTrim,std::shared_ptr<anurbs::BrepTrim>> *)
           pybind11::class_<anurbs::BrepTrim,std::shared_ptr<anurbs::BrepTrim>>::
           def_property_readonly<anurbs::Ref<anurbs::BrepFace>(anurbs::BrepTrim::*)()const>
                     (pcVar1,"face",(offset_in_Model_to_subr *)&local_78);
  local_88 = loop;
  local_80 = 0;
  pcVar1 = (class_<anurbs::BrepTrim,std::shared_ptr<anurbs::BrepTrim>> *)
           pybind11::class_<anurbs::BrepTrim,std::shared_ptr<anurbs::BrepTrim>>::
           def_property_readonly<anurbs::Ref<anurbs::BrepLoop>(anurbs::BrepTrim::*)()const>
                     (pcVar1,"loop",(offset_in_Model_to_subr *)&local_88);
  local_98 = surface_geometry;
  local_90 = 0;
  pybind11::class_<anurbs::BrepTrim,std::shared_ptr<anurbs::BrepTrim>>::
  def_property_readonly<anurbs::Ref<anurbs::NurbsSurfaceGeometry<3l>>(anurbs::BrepTrim::*)()const>
            (pcVar1,"surface_geometry",(offset_in_Model_to_subr *)&local_98);
  pybind11::object::~object((object *)&local_c0);
  Model::register_python_data_type<anurbs::BrepTrim>(m,model);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = BrepTrim;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Holder>(m, name.c_str())
            // read-only properties
            .def_property_readonly("brep", &Type::brep)
            .def_property_readonly("curve_2d", &Type::curve_2d)
            .def_property_readonly("curve_3d", &Type::curve_3d)
            .def_property_readonly("curve_geometry", &Type::curve_geometry)
            .def_property_readonly("edge", &Type::edge)
            .def_property_readonly("face", &Type::face)
            .def_property_readonly("loop", &Type::loop)
            .def_property_readonly("surface_geometry", &Type::surface_geometry)
        ;

        Model::register_python_data_type<Type>(m, model);
    }